

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O3

GArray * g_array_remove_range(GArray *farray,guint index_,guint length)

{
  int iVar1;
  int iVar2;
  guint gVar3;
  guint gVar4;
  
  gVar3 = index_;
  gVar4 = length;
  if (length != 0 && *(long *)&farray[1].len != 0) {
    do {
      (**(code **)&farray[1].len)(farray->data + *(int *)&farray[1].data * gVar3);
      gVar4 = gVar4 - 1;
      gVar3 = gVar3 + 1;
    } while (gVar4 != 0);
  }
  gVar3 = length + index_;
  iVar2 = farray->len - gVar3;
  if (iVar2 != 0) {
    iVar1 = *(int *)&farray[1].data;
    memmove(farray->data + index_ * iVar1,farray->data + gVar3 * iVar1,(ulong)(uint)(iVar2 * iVar1))
    ;
    gVar3 = farray->len;
  }
  farray->len = gVar3 - length;
  if (((ulong)farray[1].data & 0x100000000) != 0) {
    memset(farray->data + (gVar3 - length) * *(uint *)&farray[1].data,0,
           (ulong)*(uint *)&farray[1].data);
  }
  return farray;
}

Assistant:

GArray* g_array_remove_range (GArray *farray,
        guint   index_,
        guint   length)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);
    g_return_val_if_fail (index_ <= array->len, NULL);
    g_return_val_if_fail (index_ + length <= array->len, NULL);

    if (array->clear_func != NULL)
    {
        guint i;

        for (i = 0; i < length; i++)
            array->clear_func (g_array_elt_pos (array, index_ + i));
    }

    if (index_ + length != array->len)
        memmove (g_array_elt_pos (array, index_),
                g_array_elt_pos (array, index_ + length),
                (array->len - (index_ + length)) * array->elt_size);

    array->len -= length;
    if (g_mem_gc_friendly)
        g_array_elt_zero (array, array->len, length);
    else
        g_array_zero_terminate (array);

    return farray;
}